

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void gl4cts::EnhancedLayouts::debug_proc
               (GLenum source,GLenum type,GLuint id,GLenum severity,GLsizei param_5,GLchar *message,
               void *info)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  undefined8 auStack_198 [45];
  
  pcVar3 = "Unknown";
  pcVar1 = "Unknown";
  if (source - 0x8246 < 6) {
    pcVar1 = &DAT_01652128 + *(int *)(&DAT_01652128 + (ulong)(source - 0x8246) * 4);
  }
  switch(type) {
  case 0x824c:
    pcVar2 = "ERROR";
    break;
  case 0x824d:
    pcVar2 = "DEPRECATED_BEHAVIOR";
    break;
  case 0x824e:
    pcVar2 = "UNDEFINED_BEHAVIOR";
    break;
  case 0x824f:
    pcVar2 = "PORTABILITY";
    break;
  case 0x8250:
    pcVar2 = "PERFORMANCE";
    break;
  case 0x8251:
    pcVar2 = "OTHER";
    break;
  default:
    if (type == 0x8268) {
      pcVar2 = "MARKER";
    }
    else if (type == 0x8269) {
      pcVar2 = "PUSH_GROUP";
    }
    else {
      pcVar2 = "Unknown";
      if (type == 0x826a) {
        pcVar2 = "POP_GROUP";
      }
    }
  }
  if (severity == 0x826b) {
    pcVar3 = "N";
  }
  else if (severity == 0x9148) {
    pcVar3 = "L";
  }
  else if (severity == 0x9147) {
    pcVar3 = "M";
  }
  else if (severity == 0x9146) {
    pcVar3 = "H";
  }
  local_1b0 = *(undefined1 (*) [8])(*info + 0x10);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::operator<<((ostream *)&local_1a8,"DEBUG_INFO: ");
  *(undefined8 *)((long)auStack_198 + (long)local_1a8[-3]) = 3;
  std::operator<<((ostream *)&local_1a8,pcVar1);
  std::operator<<((ostream *)&local_1a8,"|");
  std::operator<<((ostream *)&local_1a8,pcVar3);
  std::operator<<((ostream *)&local_1a8,"|");
  *(undefined8 *)((long)auStack_198 + (long)local_1a8[-3]) = 0x12;
  std::operator<<((ostream *)&local_1a8,pcVar2);
  std::operator<<((ostream *)&local_1a8,"|");
  *(undefined8 *)((long)auStack_198 + (long)local_1a8[-3]) = 0xc;
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::operator<<((ostream *)&local_1a8,": ");
  std::operator<<((ostream *)&local_1a8,message);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return;
}

Assistant:

void GLW_APIENTRY debug_proc(GLenum source, GLenum type, GLuint id, GLenum severity, GLsizei /* length */,
							 const GLchar* message, void* info)
{
	deqp::Context* ctx = (deqp::Context*)info;

	const GLchar* source_str   = "Unknown";
	const GLchar* type_str	 = "Unknown";
	const GLchar* severity_str = "Unknown";

	switch (source)
	{
	case GL_DEBUG_SOURCE_API:
		source_str = "API";
		break;
	case GL_DEBUG_SOURCE_APPLICATION:
		source_str = "APP";
		break;
	case GL_DEBUG_SOURCE_OTHER:
		source_str = "OTR";
		break;
	case GL_DEBUG_SOURCE_SHADER_COMPILER:
		source_str = "COM";
		break;
	case GL_DEBUG_SOURCE_THIRD_PARTY:
		source_str = "3RD";
		break;
	case GL_DEBUG_SOURCE_WINDOW_SYSTEM:
		source_str = "WS";
		break;
	default:
		break;
	}

	switch (type)
	{
	case GL_DEBUG_TYPE_DEPRECATED_BEHAVIOR:
		type_str = "DEPRECATED_BEHAVIOR";
		break;
	case GL_DEBUG_TYPE_ERROR:
		type_str = "ERROR";
		break;
	case GL_DEBUG_TYPE_MARKER:
		type_str = "MARKER";
		break;
	case GL_DEBUG_TYPE_OTHER:
		type_str = "OTHER";
		break;
	case GL_DEBUG_TYPE_PERFORMANCE:
		type_str = "PERFORMANCE";
		break;
	case GL_DEBUG_TYPE_POP_GROUP:
		type_str = "POP_GROUP";
		break;
	case GL_DEBUG_TYPE_PORTABILITY:
		type_str = "PORTABILITY";
		break;
	case GL_DEBUG_TYPE_PUSH_GROUP:
		type_str = "PUSH_GROUP";
		break;
	case GL_DEBUG_TYPE_UNDEFINED_BEHAVIOR:
		type_str = "UNDEFINED_BEHAVIOR";
		break;
	default:
		break;
	}

	switch (severity)
	{
	case GL_DEBUG_SEVERITY_HIGH:
		severity_str = "H";
		break;
	case GL_DEBUG_SEVERITY_LOW:
		severity_str = "L";
		break;
	case GL_DEBUG_SEVERITY_MEDIUM:
		severity_str = "M";
		break;
	case GL_DEBUG_SEVERITY_NOTIFICATION:
		severity_str = "N";
		break;
	default:
		break;
	}

	ctx->getTestContext().getLog() << tcu::TestLog::Message << "DEBUG_INFO: " << std::setw(3) << source_str << "|"
								   << severity_str << "|" << std::setw(18) << type_str << "|" << std::setw(12) << id
								   << ": " << message << tcu::TestLog::EndMessage;
}